

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O1

void crnlib::LenEnc_Encode2
               (CLenPriceEnc *p,CRangeEnc *rc,UInt32 symbol,UInt32 posState,Bool updatePrice,
               UInt32 *ProbPrices)

{
  UInt16 *prob;
  UInt32 *pUVar1;
  UInt32 m;
  ulong uVar2;
  UInt32 m_2;
  uint uVar3;
  bool bVar4;
  
  if (symbol < 8) {
    RangeEnc_EncodeBit(rc,(UInt16 *)p,0);
    uVar2 = 1;
    uVar3 = 2;
    do {
      bVar4 = (symbol >> (uVar3 & 0x1f) & 1) != 0;
      RangeEnc_EncodeBit(rc,(p->p).low + posState * 8 + uVar2,(uint)bVar4);
      uVar2 = (ulong)((uint)bVar4 + (int)uVar2 * 2);
      bVar4 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar4);
  }
  else {
    uVar2 = 1;
    RangeEnc_EncodeBit(rc,(UInt16 *)p,1);
    prob = &(p->p).choice2;
    if (symbol < 0x10) {
      RangeEnc_EncodeBit(rc,prob,0);
      uVar2 = 1;
      uVar3 = 2;
      do {
        bVar4 = (symbol - 8 >> (uVar3 & 0x1f) & 1) != 0;
        RangeEnc_EncodeBit(rc,(p->p).mid + posState * 8 + uVar2,(uint)bVar4);
        uVar2 = (ulong)((uint)bVar4 + (int)uVar2 * 2);
        bVar4 = uVar3 != 0;
        uVar3 = uVar3 - 1;
      } while (bVar4);
    }
    else {
      RangeEnc_EncodeBit(rc,prob,1);
      uVar3 = 7;
      do {
        bVar4 = (symbol - 0x10 >> (uVar3 & 0x1f) & 1) != 0;
        RangeEnc_EncodeBit(rc,(p->p).high + uVar2,(uint)bVar4);
        uVar2 = (ulong)((uint)bVar4 + (int)uVar2 * 2);
        bVar4 = uVar3 != 0;
        uVar3 = uVar3 - 1;
      } while (bVar4);
    }
  }
  if (updatePrice != 0) {
    pUVar1 = p->counters + posState;
    *pUVar1 = *pUVar1 - 1;
    if (*pUVar1 == 0) {
      LenPriceEnc_UpdateTable(p,posState,ProbPrices);
      return;
    }
  }
  return;
}

Assistant:

static void LenEnc_Encode2(CLenPriceEnc* p, CRangeEnc* rc, UInt32 symbol, UInt32 posState, Bool updatePrice, UInt32* ProbPrices) {
  LenEnc_Encode(&p->p, rc, symbol, posState);
  if (updatePrice)
    if (--p->counters[posState] == 0)
      LenPriceEnc_UpdateTable(p, posState, ProbPrices);
}